

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

bool pbrt::anon_unknown_3::matchPrefix(string *str,string *prefix)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong in_RSI;
  ulong in_RDI;
  size_t i;
  ulong local_20;
  bool local_1;
  
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < uVar2) {
    local_1 = false;
  }
  else {
    for (local_20 = 0; uVar2 = std::__cxx11::string::size(), local_20 < uVar2;
        local_20 = local_20 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
      cVar1 = *pcVar4;
      pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI);
      if (cVar1 != *pcVar4) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool matchPrefix(const std::string &str, const std::string &prefix) {
    if (prefix.size() > str.size())
        return false;
    for (size_t i = 0; i < prefix.size(); ++i)
        if (prefix[i] != str[i])
            return false;
    return true;
}